

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O0

_Bool obj_known_damage(object *obj,int *normal_damage,int *brand_damage,int *slay_damage,
                      _Bool *nonweap_slay,_Bool throw)

{
  _Bool _Var1;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  object *poVar7;
  object *poVar8;
  player_state_conflict *ppVar9;
  byte local_1f3;
  byte local_1f2;
  byte local_1f1;
  object *slot_obj;
  object *current_weapon;
  wchar_t weapon_slot;
  player_state state;
  wchar_t multiplier;
  wchar_t melee_adj_mult;
  _Bool ammo;
  _Bool weapon;
  object *bow;
  _Bool *p_Stack_a0;
  _Bool has_brands_or_slays;
  _Bool *total_slays;
  _Bool *total_brands;
  int local_88;
  wchar_t old_blows;
  wchar_t round;
  wchar_t temp1;
  wchar_t temp0;
  wchar_t crit_scl_round;
  wchar_t crit_round_add;
  wchar_t crit_round_mult;
  wchar_t crit_add;
  wchar_t crit_div;
  wchar_t crit_mult;
  wchar_t xtra_precrit;
  wchar_t xtra_postcrit;
  wchar_t plus;
  wchar_t total_dam;
  wchar_t dam;
  wchar_t sides;
  wchar_t dice;
  wchar_t i;
  _Bool throw_local;
  _Bool *nonweap_slay_local;
  int *slay_damage_local;
  int *brand_damage_local;
  int *normal_damage_local;
  object *obj_local;
  
  xtra_precrit = L'\0';
  crit_mult = L'\0';
  crit_div = L'\0';
  total_brands._4_4_ = L'\0';
  _Var1 = false;
  dice._3_1_ = throw;
  _i = nonweap_slay;
  nonweap_slay_local = (_Bool *)slay_damage;
  slay_damage_local = brand_damage;
  brand_damage_local = normal_damage;
  normal_damage_local = (int *)obj;
  poVar7 = equipped_item_by_slot_name(player,"shooting");
  _Var2 = tval_is_melee_weapon((object *)normal_damage_local);
  local_1f1 = 0;
  if (_Var2) {
    local_1f1 = dice._3_1_ ^ 0xff;
  }
  local_1f1 = local_1f1 & 1;
  local_1f2 = 0;
  if (((player->state).ammo_tval == (uint)*(byte *)(normal_damage_local + 0xf)) &&
     (local_1f2 = 0, poVar7 != (object *)0x0)) {
    local_1f2 = dice._3_1_ ^ 0xff;
  }
  local_1f2 = local_1f2 & 1;
  local_1f3 = 1;
  if (local_1f2 == 0) {
    local_1f3 = dice._3_1_;
  }
  state.el_info[0x18]._1_3_ = 0;
  state.el_info[0x18].res_level._0_1_ = (local_1f3 & 1) == 0;
  state.el_info[0x17].res_level = 1;
  state.el_info[0x17].flags = '\0';
  state.el_info[0x17]._3_1_ = 0;
  current_weapon._0_4_ = slot_by_name(player,"weapon");
  poVar8 = slot_object(player,(wchar_t)current_weapon);
  if (local_1f1 != 0) {
    (player->body).slots[(wchar_t)current_weapon].obj = (object *)normal_damage_local;
  }
  memcpy((void *)((long)&current_weapon + 4),&player->state,0x120);
  state.stat_add[3] = L'\0';
  state.stat_ind[1] = L'\0';
  calc_bonuses(player,(player_state_conflict *)((long)&current_weapon + 4),true,false);
  (player->body).slots[(wchar_t)current_weapon].obj = poVar8;
  dam = (wchar_t)*(byte *)(*(long *)(normal_damage_local + 10) + 0x42);
  total_dam = (wchar_t)*(byte *)(*(long *)(normal_damage_local + 10) + 0x43);
  if ((dam == L'\0') || (total_dam == L'\0')) {
    obj_local._7_1_ = false;
  }
  else {
    plus = (total_dam + L'\x01') * dam * 5;
    wVar4 = object_to_hit(*(object **)(normal_damage_local + 10));
    xtra_precrit = wVar4 + xtra_precrit;
    if (local_1f1 == 0) {
      if (local_1f2 == 0) {
        ppVar9 = &player->state;
        iVar3 = object_weight_one((object *)normal_damage_local);
        calculate_missile_crits
                  ((player_state *)ppVar9,(int)iVar3,xtra_precrit,false,&crit_add,&crit_round_add,
                   &crit_round_mult,&crit_scl_round,&temp0,&temp1);
        wVar4 = object_to_dam(*(object **)(normal_damage_local + 10));
        plus = wVar4 * 10 + plus;
        iVar3 = object_weight_one((object *)normal_damage_local);
        plus = ((int)iVar3 / 0xc + 2) * plus;
      }
      else {
        ppVar9 = &player->state;
        iVar3 = object_weight_one((object *)normal_damage_local);
        calculate_missile_crits
                  ((player_state *)ppVar9,(int)iVar3,xtra_precrit,true,&crit_add,&crit_round_add,
                   &crit_round_mult,&crit_scl_round,&temp0,&temp1);
        wVar4 = object_to_dam(*(object **)(normal_damage_local + 10));
        plus = wVar4 * 10 + plus;
        wVar4 = object_to_dam(poVar7->known);
        plus = wVar4 * 10 + plus;
      }
    }
    else {
      crit_mult = state.to_a * 10;
      wVar4 = object_to_dam(*(object **)(normal_damage_local + 10));
      crit_div = wVar4 * 10 + crit_div;
      iVar3 = object_weight_one((object *)normal_damage_local);
      calculate_melee_crits
                ((player_state *)((long)&current_weapon + 4),(int)iVar3,xtra_precrit,&crit_add,
                 &crit_round_add,&crit_round_mult,&crit_scl_round,&temp0,&temp1);
      total_brands._4_4_ = state.skills[9];
    }
    if (local_1f2 != 0) {
      state.el_info[0x17] = (element_info)(player->state).ammo_mult;
    }
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
    copy_brands(&total_slays,*(_Bool **)(*(long *)(normal_damage_local + 10) + 0xd8));
    if ((local_1f2 != 0) && (poVar7->known != (object *)0x0)) {
      copy_brands(&total_slays,poVar7->known->brands);
    }
    p_Stack_a0 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    copy_slays(&stack0xffffffffffffff60,*(_Bool **)(*(long *)(normal_damage_local + 10) + 0xe0));
    if ((local_1f2 != 0) && (poVar7->known != (object *)0x0)) {
      copy_slays(&stack0xffffffffffffff60,poVar7->known->slays);
    }
    *_i = false;
    if (local_1f1 != 0) {
      for (sides = L'\x02'; sides < (int)(uint)(player->body).count; sides = sides + L'\x01') {
        poVar7 = slot_object(player,sides);
        if ((poVar7 != (object *)0x0) &&
           ((poVar7->known->brands != (_Bool *)0x0 || (poVar7->known->slays != (_Bool *)0x0)))) {
          *_i = true;
          copy_brands(&total_slays,poVar7->known->brands);
          copy_slays(&stack0xffffffffffffff60,poVar7->known->slays);
        }
      }
      for (sides = L'\x01'; sides < (int)(uint)z_info->brand_max; sides = sides + L'\x01') {
        _Var2 = player_has_temporary_brand(player,sides);
        if ((_Var2) && (_Var2 = append_brand(&total_slays,sides), _Var2)) {
          *_i = true;
        }
      }
      for (sides = L'\x01'; sides < (int)(uint)z_info->slay_max; sides = sides + L'\x01') {
        _Var2 = player_has_temporary_slay(player,sides);
        if ((_Var2) && (_Var2 = append_slay(&stack0xffffffffffffff60,sides), _Var2)) {
          *_i = true;
        }
      }
    }
    for (sides = L'\x01'; sides < (int)(uint)z_info->brand_max; sides = sides + L'\x01') {
      if ((total_slays[sides] & 1U) != 0) {
        _Var1 = true;
        iVar5 = plus * (((int)state.el_info[0x17] + brands[sides].multiplier) -
                       (int)state.el_info[0x18]) + crit_div;
        iVar5 = iVar5 * crit_add + crit_round_add * 10 +
                (iVar5 * crit_scl_round + temp0 * 10) / temp1;
        iVar6 = iVar5 / crit_round_mult + crit_mult;
        iVar5 = iVar5 % crit_round_mult;
        if (local_1f1 == 0) {
          if (local_1f2 == 0) {
            xtra_postcrit = (uint)((crit_round_mult + L'\x01') / 2 < iVar5) + iVar6;
          }
          else {
            iVar5 = iVar6 * (player->state).num_shots +
                    (iVar5 * (player->state).num_shots) / crit_round_mult;
            xtra_postcrit = iVar5 / 10 + (uint)(4 < iVar5 % 10);
          }
        }
        else {
          iVar5 = iVar6 * total_brands._4_4_ + (iVar5 * total_brands._4_4_) / crit_round_mult;
          xtra_postcrit = iVar5 / 100 + (uint)(0x31 < iVar5 % 100);
        }
        slay_damage_local[sides] = xtra_postcrit;
      }
    }
    for (sides = L'\x01'; sides < (int)(uint)z_info->slay_max; sides = sides + L'\x01') {
      if ((p_Stack_a0[sides] & 1U) != 0) {
        _Var1 = true;
        iVar5 = plus * (((int)state.el_info[0x17] + slays[sides].multiplier) -
                       (int)state.el_info[0x18]) + crit_div;
        iVar5 = iVar5 * crit_add + crit_round_add * 10 +
                (iVar5 * crit_scl_round + temp0 * 10) / temp1;
        iVar6 = iVar5 / crit_round_mult + crit_mult;
        iVar5 = iVar5 % crit_round_mult;
        if (local_1f1 == 0) {
          if (local_1f2 == 0) {
            xtra_postcrit = (uint)((crit_round_mult + L'\x01') / 2 <= iVar5) + iVar6;
          }
          else {
            iVar5 = iVar6 * (player->state).num_shots +
                    (iVar5 * (player->state).num_shots) / crit_round_mult;
            xtra_postcrit = iVar5 / 10 + (uint)(4 < iVar5 % 10);
          }
        }
        else {
          iVar5 = iVar6 * total_brands._4_4_ + (iVar5 * total_brands._4_4_) / crit_round_mult;
          xtra_postcrit = iVar5 / 100 + (uint)(0x31 < iVar5 % 100);
        }
        *(wchar_t *)(nonweap_slay_local + (long)sides * 4) = xtra_postcrit;
      }
    }
    round = plus * (int)state.el_info[0x17] + crit_div;
    old_blows = round * crit_add + crit_round_add * 10 +
                (round * crit_scl_round + temp0 * 10) / temp1;
    iVar5 = old_blows / crit_round_mult + crit_mult;
    local_88 = old_blows % crit_round_mult;
    if (local_1f1 == 0) {
      if (local_1f2 == 0) {
        xtra_postcrit = (uint)((crit_round_mult + L'\x01') / 2 < local_88) + iVar5;
      }
      else {
        round = iVar5 * (player->state).num_shots +
                (local_88 * (player->state).num_shots) / crit_round_mult;
        xtra_postcrit = round / 10 + (uint)(4 < round % 10);
      }
    }
    else {
      round = iVar5 * total_brands._4_4_ + (local_88 * total_brands._4_4_) / crit_round_mult;
      xtra_postcrit = round / 100 + (uint)(0x31 < round % 100);
    }
    *brand_damage_local = xtra_postcrit;
    mem_free(total_slays);
    mem_free(p_Stack_a0);
    obj_local._7_1_ = _Var1;
  }
  return obj_local._7_1_;
}

Assistant:

bool obj_known_damage(const struct object *obj, int *normal_damage,
							 int *brand_damage, int *slay_damage,
							 bool *nonweap_slay, bool throw)
{
	int i;
	int dice, sides, dam, total_dam, plus = 0;
	int xtra_postcrit = 0, xtra_precrit = 0;
	int crit_mult, crit_div, crit_add;
	int crit_round_mult, crit_round_add, crit_scl_round;
	int temp0, temp1, round;
	int old_blows = 0;
	bool *total_brands;
	bool *total_slays;
	bool has_brands_or_slays = false;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	bool weapon = tval_is_melee_weapon(obj) && !throw;
	bool ammo   = (player->state.ammo_tval == obj->tval) && (bow) && !throw;
	int melee_adj_mult = (ammo || throw) ? 0 : 1;
	int multiplier = 1;

	struct player_state state;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);

	/* Pretend we're wielding the object if it's a weapon */
	if (weapon)
		player->body.slots[weapon_slot].obj = (struct object *) obj;

	/* Calculate the player's hypothetical state */
	memcpy(&state, &player->state, sizeof(state));
	state.stat_ind[STAT_STR] = 0; //Hack - NRM
	state.stat_ind[STAT_DEX] = 0; //Hack - NRM
	calc_bonuses(player, &state, true, false);

	/* Stop pretending */
	player->body.slots[weapon_slot].obj = current_weapon;

	/* Finish if dice not known */
	dice = obj->known->dd;
	sides = obj->known->ds;
	if (!dice || !sides) return false;

	/* Calculate damage */
	dam = ((sides + 1) * dice * 5);

	plus += object_to_hit(obj->known);
	if (weapon)	{
		xtra_postcrit = state.to_d * 10;
		xtra_precrit += object_to_dam(obj->known) * 10;

		calculate_melee_crits(&state, object_weight_one(obj), plus,
			&crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		old_blows = state.num_blows;
	} else if (ammo) {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, true, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam += (object_to_dam(bow->known) * 10);
	} else {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, false, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam *= 2 + object_weight_one(obj) / 12;
	}

	if (ammo) multiplier = player->state.ammo_mult;

	/* Get the brands */
	total_brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	copy_brands(&total_brands, obj->known->brands);
	if (ammo && bow->known)
		copy_brands(&total_brands, bow->known->brands);

	/* Get the slays */
	total_slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	copy_slays(&total_slays, obj->known->slays);
	if (ammo && bow->known)
		copy_slays(&total_slays, bow->known->slays);

	/*
	 * Melee weapons may get slays and brands from other items or from
	 * temporary effects.
	 */
	*nonweap_slay = false;
	if (weapon)	{
		for (i = 2; i < player->body.count; i++) {
			struct object *slot_obj = slot_object(player, i);
			if (!slot_obj)
				continue;

			if (slot_obj->known->brands || slot_obj->known->slays)
				*nonweap_slay = true;
			else
				continue;

			/* Replace the old lists with new ones */
			copy_brands(&total_brands, slot_obj->known->brands);
			copy_slays(&total_slays, slot_obj->known->slays);
		}

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_has_temporary_brand(player, i)
					&& append_brand(&total_brands, i)) {
				*nonweap_slay = true;
			}
		}

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_has_temporary_slay(player, i)
					&& append_slay(&total_slays, i)) {
				*nonweap_slay = true;
			}
		}
	}

	/* Get damage for each brand that is active */
	for (i = 1; i < z_info->brand_max; i++) {
		if (!total_brands[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and brand in stated average */
		temp0 = dam * (multiplier + brands[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
		}

		brand_damage[i] = total_dam;
	}

	/* Get damage for each slay that is active */
	for (i = 1; i < z_info->slay_max; i++) {
		if (!total_slays[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and slay in stated average */
		temp0 = dam * (multiplier + slays[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round >= (crit_div + 1) / 2) ? 1 : 0;
		}

		slay_damage[i] = total_dam;
	}

	/* Include bonus damage in stated average */
	temp0 = dam * multiplier + xtra_precrit;
	temp1 = temp0 * crit_mult + 10 * crit_add
		+ (temp0 * crit_round_mult + 10 * crit_round_add)
		/ crit_scl_round;
	total_dam = temp1 / crit_div + xtra_postcrit;
	round = temp1 % crit_div;

	/* Normal damage, not considering brands or slays */
	if (weapon) {
		temp0 = total_dam * old_blows
			+ (round * old_blows) / crit_div;
		total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
	} else if (ammo) {
		temp0 = total_dam * player->state.num_shots
			+ (round * player->state.num_shots) / crit_div;
		total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
	} else {
		total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
	}

	*normal_damage = total_dam;

	mem_free(total_brands);
	mem_free(total_slays);
	return has_brands_or_slays;
}